

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O0

CloudNode * Kit_TruthToCloud_rec(CloudManager *dd,uint *pTruth,int nVars,int nVarsAll)

{
  int iVar1;
  uint *pIn1;
  uint *pTruth1;
  uint *pTruth0;
  CloudNode *pCof1;
  CloudNode *pCof0;
  int nVarsAll_local;
  int nVars_local;
  uint *pTruth_local;
  CloudManager *dd_local;
  
  if (nVars < 6) {
    dd_local = (CloudManager *)Kit_TruthToCloud5_rec(dd,*pTruth,nVars,nVarsAll);
  }
  else {
    iVar1 = Kit_TruthIsConst0(pTruth,nVars);
    if (iVar1 == 0) {
      iVar1 = Kit_TruthIsConst1(pTruth,nVars);
      if (iVar1 == 0) {
        iVar1 = Kit_TruthWordNum(nVars + -1);
        pIn1 = pTruth + iVar1;
        iVar1 = Kit_TruthIsEqual(pTruth,pIn1,nVars + -1);
        if (iVar1 == 0) {
          iVar1 = Kit_TruthIsOpposite(pTruth,pIn1,nVars + -1);
          if (iVar1 == 0) {
            pCof1 = Kit_TruthToCloud_rec(dd,pTruth,nVars + -1,nVarsAll);
            pTruth0 = &Kit_TruthToCloud_rec(dd,pIn1,nVars + -1,nVarsAll)->s;
          }
          else {
            pCof1 = Kit_TruthToCloud_rec(dd,pTruth,nVars + -1,nVarsAll);
            pTruth0 = (uint *)((ulong)pCof1 ^ 1);
          }
          dd_local = (CloudManager *)Cloud_MakeNode(dd,nVarsAll - nVars,(CloudNode *)pTruth0,pCof1);
        }
        else {
          dd_local = (CloudManager *)Kit_TruthToCloud_rec(dd,pTruth,nVars + -1,nVarsAll);
        }
      }
      else {
        dd_local = (CloudManager *)dd->one;
      }
    }
    else {
      dd_local = (CloudManager *)dd->zero;
    }
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * Kit_TruthToCloud_rec( CloudManager * dd, unsigned * pTruth, int nVars, int nVarsAll )
{
    CloudNode * pCof0, * pCof1;
    unsigned * pTruth0, * pTruth1;
    if ( nVars <= 5 )
        return Kit_TruthToCloud5_rec( dd, pTruth[0], nVars, nVarsAll );
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return dd->zero;
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return dd->one;
//    Count++;
    pTruth0 = pTruth;
    pTruth1 = pTruth + Kit_TruthWordNum(nVars-1);
    if ( Kit_TruthIsEqual( pTruth0, pTruth1, nVars - 1 ) )
        return Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
    if ( Kit_TruthIsOpposite( pTruth0, pTruth1, nVars - 1 ) )
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud_rec( dd, pTruth1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}